

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperEQ<bool,shared_ptr<B>>
          (internal *this,char *lhs_expression,char *rhs_expression,bool *lhs,shared_ptr<B> *rhs)

{
  long *plVar1;
  bool bVar3;
  long in_FS_OFFSET;
  AssertionResult AVar4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  plVar1 = (rhs->super_shared_ptr_base).pn.pn;
  if (plVar1 == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = 0 < *plVar1;
  }
  if (*lhs == bVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
LAB_0013ca1b:
      __stack_chk_fail();
    }
    AVar4 = AssertionSuccess();
    sVar2 = AVar4.message_.ptr_;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) goto LAB_0013ca1b;
    AVar4 = CmpHelperEQFailure<bool,shared_ptr<B>>(this,lhs_expression,rhs_expression,lhs,rhs);
    sVar2 = AVar4.message_.ptr_;
  }
  AVar4.message_.ptr_ = sVar2.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}